

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

void __thiscall
duckdb::InternalException::
InternalException<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (InternalException *this,string *msg,hugeint_t params,uhugeint_t params_1,
          uhugeint_t params_2)

{
  uhugeint_t params_2_00;
  hugeint_t params_00;
  uint64_t in_stack_ffffffffffffffc8;
  _Alloc_hider in_stack_ffffffffffffffd0;
  char local_20 [16];
  
  params_00.upper = params_1.lower;
  params_00.lower = params.upper;
  params_2_00.upper = (uint64_t)in_stack_ffffffffffffffd0._M_p;
  params_2_00.lower = in_stack_ffffffffffffffc8;
  Exception::ConstructMessage<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
            ((string *)&stack0xffffffffffffffd0,(Exception *)msg,(string *)params.lower,params_00,
             params_2,params_2_00);
  InternalException(this,(string *)&stack0xffffffffffffffd0);
  if (in_stack_ffffffffffffffd0._M_p != local_20) {
    operator_delete(in_stack_ffffffffffffffd0._M_p);
  }
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}